

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedBrs.cpp
# Opt level: O0

bool wasm::tooCostlyToRunUnconditionally(PassOptions *passOptions,Expression *one,Expression *two)

{
  uint *puVar1;
  CostAnalyzer local_34;
  CostAnalyzer local_30;
  Index local_2c;
  Expression *pEStack_28;
  uint max;
  Expression *two_local;
  Expression *one_local;
  PassOptions *passOptions_local;
  
  if (passOptions->shrinkLevel < 2) {
    pEStack_28 = two;
    two_local = one;
    one_local = (Expression *)passOptions;
    CostAnalyzer::CostAnalyzer(&local_30,one);
    CostAnalyzer::CostAnalyzer(&local_34,pEStack_28);
    puVar1 = std::max<unsigned_int>(&local_30.cost,&local_34.cost);
    local_2c = *puVar1;
    passOptions_local._7_1_ = tooCostlyToRunUnconditionally((PassOptions *)one_local,local_2c);
  }
  else {
    passOptions_local._7_1_ = false;
  }
  return passOptions_local._7_1_;
}

Assistant:

static bool tooCostlyToRunUnconditionally(const PassOptions& passOptions,
                                          Expression* one,
                                          Expression* two) {
  // If we care entirely about code size, just do it for that reason (early
  // exit to avoid work).
  if (passOptions.shrinkLevel >= 2) {
    return false;
  }

  // Consider the cost of executing all the code unconditionally, which adds
  // either the cost of running one or two, so the maximum is the worst case.
  auto max = std::max(CostAnalyzer(one).cost, CostAnalyzer(two).cost);
  return tooCostlyToRunUnconditionally(passOptions, max);
}